

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char_const(&)[32],kj::String&,char_const(&)[3],kj::String&,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [32],String *params_1,
          char (*params_2) [3],String *params_3,char (*params_4) [3])

{
  char *pcVar1;
  Branch *pBVar2;
  ArrayPtr<const_char> *in_stack_ffffffffffffff78;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  kj *local_60;
  char *local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_58 = (char *)strlen((char *)this);
  pcVar1 = *(char **)(*params + 8);
  local_70.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_70.ptr = *(char **)*params;
  }
  local_70.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_70.size_ = (size_t)(char *)0x0;
  }
  local_60 = this;
  local_80.size_ = strlen((char *)params_1);
  pBVar2 = *(Branch **)(params_2[2] + 2);
  local_40.ptr = (char *)pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_40.ptr = *(char **)params_2;
  }
  local_40.size_ = (size_t)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_40.size_ = (size_t)(char *)0x0;
  }
  local_80.ptr = (char *)params_1;
  local_50.size_ = strlen((char *)params_3);
  local_50.ptr = (char *)params_3;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_60,&local_70,&local_80,&local_40,&local_50,
             in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}